

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O0

void __thiscall
TApp_IncorrectConstructionVectorTakeLast_Test::TestBody
          (TApp_IncorrectConstructionVectorTakeLast_Test *this)

{
  bool bVar1;
  Option *pOVar2;
  AssertHelper local_b8;
  Message local_b0 [2];
  IncorrectConstruction *anon_var_0;
  char *pcStack_98;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  string local_88;
  allocator local_51;
  string local_50;
  Option *local_30;
  Option *cat;
  vector<int,_std::allocator<int>_> vec;
  TApp_IncorrectConstructionVectorTakeLast_Test *this_local;
  
  vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  CLI::std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&cat);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"--vec",&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,"",(allocator *)((long)&gtest_msg.value + 7));
  pOVar2 = CLI::App::add_option<int>
                     (&(this->super_TApp).app,&local_50,(vector<int,_std::allocator<int>_> *)&cat,
                      &local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_30 = pOVar2;
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff68,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff68);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      CLI::Option::multi_option_policy(local_30,TakeLast);
    }
    if ((anon_var_0._7_1_ & 1) != 0) goto LAB_0011781d;
    pcStack_98 = 
    "Expected: cat->multi_option_policy(CLI::MultiOptionPolicy::TakeLast) throws an exception of type CLI::IncorrectConstruction.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_b0);
  testing::internal::AssertHelper::AssertHelper
            (&local_b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
             ,0x9b,pcStack_98);
  testing::internal::AssertHelper::operator=(&local_b8,local_b0);
  testing::internal::AssertHelper::~AssertHelper(&local_b8);
  testing::Message::~Message(local_b0);
LAB_0011781d:
  CLI::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&cat);
  return;
}

Assistant:

TEST_F(TApp, IncorrectConstructionVectorTakeLast) {
    std::vector<int> vec;
    auto cat = app.add_option("--vec", vec);
    EXPECT_THROW(cat->multi_option_policy(CLI::MultiOptionPolicy::TakeLast), CLI::IncorrectConstruction);
}